

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.c
# Opt level: O3

ssh_key * dsa_new_priv(ssh_keyalg *self,ptrlen pub,ptrlen priv)

{
  uint uVar1;
  ssh_key *key;
  ssh_keyalg *psVar2;
  ssh_hash *psVar3;
  mp_int *a;
  ptrlen pVar4;
  uchar digest [20];
  BinarySource src [1];
  uchar auStack_78 [32];
  BinarySource local_58;
  
  key = dsa_new_pub(self,pub);
  if (key == (ssh_key *)0x0) {
    return (ssh_key *)0x0;
  }
  local_58.binarysource_ = &local_58;
  local_58.pos = 0;
  local_58.err = BSE_NO_ERROR;
  local_58.data = priv.ptr;
  local_58.len = priv.len;
  psVar2 = (ssh_keyalg *)BinarySource_get_mp_ssh2(local_58.binarysource_);
  key[-1].vt = psVar2;
  if ((local_58.binarysource_)->err == BSE_NO_ERROR) {
    pVar4 = BinarySource_get_string(local_58.binarysource_);
    if (pVar4.len == 0x14) {
      psVar3 = sha1_select(&ssh_sha1);
      if (psVar3 != (ssh_hash *)0x0) {
        (*psVar3->vt->reset)(psVar3);
      }
      BinarySink_put_mp_ssh2(psVar3->binarysink_,(mp_int *)key[-5].vt);
      BinarySink_put_mp_ssh2(psVar3->binarysink_,(mp_int *)key[-4].vt);
      BinarySink_put_mp_ssh2(psVar3->binarysink_,(mp_int *)key[-3].vt);
      (*psVar3->vt->digest)(psVar3,auStack_78);
      (*psVar3->vt->free)(psVar3);
      uVar1 = smemeq(pVar4.ptr,auStack_78,0x14);
      if (uVar1 == 0) goto LAB_00155b90;
    }
    a = mp_modpow((mp_int *)key[-3].vt,(mp_int *)key[-1].vt,(mp_int *)key[-5].vt);
    uVar1 = mp_cmp_eq(a,(mp_int *)key[-2].vt);
    mp_free(a);
    if (uVar1 != 0) {
      return key;
    }
  }
LAB_00155b90:
  dsa_freekey(key);
  return (ssh_key *)0x0;
}

Assistant:

static ssh_key *dsa_new_priv(const ssh_keyalg *self, ptrlen pub, ptrlen priv)
{
    BinarySource src[1];
    ssh_key *sshk;
    struct dsa_key *dsa;
    ptrlen hash;
    unsigned char digest[20];
    mp_int *ytest;

    sshk = dsa_new_pub(self, pub);
    if (!sshk)
        return NULL;

    dsa = container_of(sshk, struct dsa_key, sshk);
    BinarySource_BARE_INIT_PL(src, priv);
    dsa->x = get_mp_ssh2(src);
    if (get_err(src)) {
        dsa_freekey(&dsa->sshk);
        return NULL;
    }

    /*
     * Check the obsolete hash in the old DSA key format.
     */
    hash = get_string(src);
    if (hash.len == 20) {
        ssh_hash *h = ssh_hash_new(&ssh_sha1);
        put_mp_ssh2(h, dsa->p);
        put_mp_ssh2(h, dsa->q);
        put_mp_ssh2(h, dsa->g);
        ssh_hash_final(h, digest);
        if (!smemeq(hash.ptr, digest, 20)) {
            dsa_freekey(&dsa->sshk);
            return NULL;
        }
    }

    /*
     * Now ensure g^x mod p really is y.
     */
    ytest = mp_modpow(dsa->g, dsa->x, dsa->p);
    if (!mp_cmp_eq(ytest, dsa->y)) {
        mp_free(ytest);
        dsa_freekey(&dsa->sshk);
        return NULL;
    }
    mp_free(ytest);

    return &dsa->sshk;
}